

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CompareDump.cpp
# Opt level: O0

uchar __thiscall comparer_context::cmp<unsigned_char>(comparer_context *this,string *name)

{
  ostream *poVar1;
  string local_1d8;
  stringstream local_1a8 [8];
  stringstream ss;
  ostream local_198 [382];
  uchar local_1a;
  uchar local_19;
  uchar e;
  string *psStack_18;
  uchar a;
  string *name_local;
  comparer_context *this_local;
  
  psStack_18 = name;
  name_local = (string *)this;
  read<unsigned_char>(this,&local_19,&local_1a);
  if (local_19 != local_1a) {
    std::__cxx11::stringstream::stringstream(local_1a8);
    poVar1 = std::operator<<(local_198,"Expected ");
    poVar1 = std::operator<<(poVar1,local_1a);
    poVar1 = std::operator<<(poVar1,", but actual is ");
    std::operator<<(poVar1,local_19);
    std::__cxx11::stringstream::str();
    failure(this,&local_1d8,psStack_18);
  }
  return local_19;
}

Assistant:

T cmp(const std::string& name) {
        T a,e;
        read(a,e);

        if(a != e) {
            std::stringstream ss;
            failure((ss<< "Expected " << e << ", but actual is " << a,
                ss.str()),name);
        }
    //  std::cout << name << " " << std::hex << a << std::endl;
        return a;
    }